

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQChar * __thiscall
SQFunctionProto::GetLocal
          (SQFunctionProto *this,SQVM *vm,SQUnsignedInteger stackbase,SQUnsignedInteger nseq,
          SQUnsignedInteger nop)

{
  SQObjectPtr *o;
  ulong local_48;
  SQUnsignedInteger i;
  SQChar *res;
  SQUnsignedInteger nvars;
  SQUnsignedInteger nop_local;
  SQUnsignedInteger nseq_local;
  SQUnsignedInteger stackbase_local;
  SQVM *vm_local;
  SQFunctionProto *this_local;
  
  if (nseq <= (ulong)this->_nlocalvarinfos) {
    nop_local = nseq;
    for (local_48 = 0; local_48 < (ulong)this->_nlocalvarinfos; local_48 = local_48 + 1) {
      if ((this->_localvarinfos[local_48]._start_op <= nop) &&
         (nop <= this->_localvarinfos[local_48]._end_op)) {
        if (nop_local == 0) {
          o = sqvector<SQObjectPtr>::operator[]
                        (&vm->_stack,stackbase + this->_localvarinfos[local_48]._pos);
          SQVM::Push(vm,o);
          return (SQChar *)
                 (this->_localvarinfos[local_48]._name.super_SQObject._unVal.nInteger + 0x38);
        }
        nop_local = nop_local - 1;
      }
    }
  }
  return (SQChar *)0x0;
}

Assistant:

const SQChar* SQFunctionProto::GetLocal(SQVM *vm,SQUnsignedInteger stackbase,SQUnsignedInteger nseq,SQUnsignedInteger nop)
{
    SQUnsignedInteger nvars=_nlocalvarinfos;
    const SQChar *res=NULL;
    if(nvars>=nseq){
        for(SQUnsignedInteger i=0;i<nvars;i++){
            if(_localvarinfos[i]._start_op<=nop && _localvarinfos[i]._end_op>=nop)
            {
                if(nseq==0){
                    vm->Push(vm->_stack[stackbase+_localvarinfos[i]._pos]);
                    res=_stringval(_localvarinfos[i]._name);
                    break;
                }
                nseq--;
            }
        }
    }
    return res;
}